

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O0

int cmime_list_insert_next(CMimeList_T *list,CMimeListElem_T *elem,void *data)

{
  _CMimeListElem *__ptr;
  CMimeListElem_T *new;
  void *data_local;
  CMimeListElem_T *elem_local;
  CMimeList_T *list_local;
  
  __ptr = (_CMimeListElem *)calloc(1,0x18);
  if (list != (CMimeList_T *)0x0) {
    if (__ptr == (_CMimeListElem *)0x0) {
      list_local._4_4_ = -1;
    }
    else if ((elem == (CMimeListElem_T *)0x0) && (list->size != 0)) {
      free(__ptr);
      list_local._4_4_ = -1;
    }
    else {
      __ptr->data = data;
      if (list->size == 0) {
        list->head = __ptr;
        list->tail = __ptr;
        __ptr->next = (_CMimeListElem *)0x0;
        __ptr->prev = (_CMimeListElem *)0x0;
      }
      else {
        __ptr->next = elem->next;
        __ptr->prev = elem;
        if (elem->next == (_CMimeListElem *)0x0) {
          list->tail = __ptr;
        }
        else {
          elem->next->prev = __ptr;
        }
        elem->next = __ptr;
      }
      list->size = list->size + 1;
      list_local._4_4_ = 0;
    }
    return list_local._4_4_;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0x84,"int cmime_list_insert_next(CMimeList_T *, CMimeListElem_T *, void *)");
}

Assistant:

int cmime_list_insert_next(CMimeList_T *list, CMimeListElem_T *elem, void *data) {
    CMimeListElem_T *new = (CMimeListElem_T *)calloc(1,sizeof(CMimeListElem_T));
    
    assert(list);
        
    if(new == NULL) {
        return(-1);
    }
    
    /* no null element if list not empty */
    if(elem == NULL && cmime_list_size(list) != 0) {
        free(new);
        return(-1);
    }
 
    new->data = data;
 
    if(cmime_list_size(list) == 0) {
        list->head = new;
        list->tail = new;
        new->next = NULL;
        new->prev = NULL;
    } else {
        new->next = elem->next;
        new->prev = elem;

        if(elem->next == NULL) {
            list->tail = new;
        } else {
            elem->next->prev = new;
        }

        elem->next = new; 
    }
 
    list->size++;
 
    return(0);
}